

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh-certs.c
# Opt level: O0

ssh_key * opensshcert_new_pub(ssh_keyalg *self,ptrlen pub)

{
  ssh_keyalg *self_00;
  opensshcert_key *poVar1;
  ssh_key *psVar2;
  ptrlen pub_00;
  opensshcert_key *ck;
  strbuf *basepub;
  ssh_keyalg *self_local;
  ptrlen pub_local;
  
  pub_local.ptr = (void *)pub.len;
  self_local = (ssh_keyalg *)pub.ptr;
  basepub = (strbuf *)self;
  poVar1 = opensshcert_new_shared(self,pub,(strbuf **)&ck);
  if (poVar1 == (opensshcert_key *)0x0) {
    pub_local.len = 0;
  }
  else {
    self_00 = (ssh_keyalg *)basepub[4].u;
    pub_00 = ptrlen_from_strbuf((strbuf *)ck);
    psVar2 = ssh_key_new_pub(self_00,pub_00);
    poVar1->basekey = psVar2;
    strbuf_free((strbuf *)ck);
    if (poVar1->basekey == (ssh_key *)0x0) {
      ssh_key_free(&poVar1->sshk);
      pub_local.len = 0;
    }
    else {
      pub_local.len = (size_t)&poVar1->sshk;
    }
  }
  return (ssh_key *)pub_local.len;
}

Assistant:

static ssh_key *opensshcert_new_pub(const ssh_keyalg *self, ptrlen pub)
{
    strbuf *basepub;
    opensshcert_key *ck = opensshcert_new_shared(self, pub, &basepub);
    if (!ck)
        return NULL;

    ck->basekey = ssh_key_new_pub(self->base_alg, ptrlen_from_strbuf(basepub));
    strbuf_free(basepub);

    if (!ck->basekey) {
        ssh_key_free(&ck->sshk);
        return NULL;
    }

    return &ck->sshk;
}